

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deThreadTest.c
# Opt level: O0

void deSemaphore_selfTest(void)

{
  deBool dVar1;
  deThread threadptr;
  deThread threadptr_00;
  bool bVar2;
  deBool ret;
  deThread consumer;
  deThread producer;
  TestBuffer testBuffer;
  deSemaphore semaphore;
  
  testBuffer._144_8_ = deSemaphore_create(1,(deSemaphoreAttributes *)0x0);
  do {
    dVar1 = deGetFalse();
    if ((dVar1 != 0) || (testBuffer._144_8_ == 0)) {
      deAssertFail("semaphore",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                   ,0x1ad);
    }
    dVar1 = deGetFalse();
  } while (dVar1 != 0);
  deSemaphore_increment(testBuffer._144_8_);
  deSemaphore_decrement(testBuffer._144_8_);
  deSemaphore_decrement(testBuffer._144_8_);
  deSemaphore_destroy(testBuffer._144_8_);
  deMemset(&producer,0,0x98);
  testBuffer.buffer._120_8_ = deSemaphore_create(0x20,(deSemaphoreAttributes *)0x0);
  testBuffer.empty = deSemaphore_create(0,(deSemaphoreAttributes *)0x0);
  do {
    dVar1 = deGetFalse();
    if (((dVar1 != 0) || (testBuffer.buffer._120_8_ == 0)) || (testBuffer.empty == 0)) {
      deAssertFail("testBuffer.empty && testBuffer.fill",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                   ,0x1c2);
    }
    dVar1 = deGetFalse();
  } while (dVar1 != 0);
  threadptr = deThread_create(consumerThread,&producer,(deThreadAttributes *)0x0);
  threadptr_00 = deThread_create(producerThread,&producer,(deThreadAttributes *)0x0);
  do {
    dVar1 = deGetFalse();
    if (((dVar1 != 0) || (threadptr == 0)) || (threadptr_00 == 0)) {
      deAssertFail("consumer && producer",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                   ,0x1c7);
    }
    dVar1 = deGetFalse();
  } while (dVar1 != 0);
  dVar1 = deThread_join(threadptr);
  bVar2 = false;
  if (dVar1 != 0) {
    dVar1 = deThread_join(threadptr_00);
    bVar2 = dVar1 != 0;
  }
  do {
    dVar1 = deGetFalse();
    if ((dVar1 != 0) || (!bVar2)) {
      deAssertFail("ret",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                   ,0x1cb);
    }
    dVar1 = deGetFalse();
  } while (dVar1 != 0);
  deThread_destroy(threadptr_00);
  deThread_destroy(threadptr);
  deSemaphore_destroy(testBuffer.buffer._120_8_);
  deSemaphore_destroy(testBuffer.empty);
  do {
    dVar1 = deGetFalse();
    if ((dVar1 != 0) || ((int)testBuffer.fill != testBuffer.fill._4_4_)) {
      deAssertFail("testBuffer.producerHash == testBuffer.consumerHash",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                   ,0x1d2);
    }
    dVar1 = deGetFalse();
  } while (dVar1 != 0);
  return;
}

Assistant:

void deSemaphore_selfTest (void)
{
	/* Basic test. */
	{
		deSemaphore	semaphore	= deSemaphore_create(1, DE_NULL);
		DE_TEST_ASSERT(semaphore);

		deSemaphore_increment(semaphore);
		deSemaphore_decrement(semaphore);
		deSemaphore_decrement(semaphore);

		deSemaphore_destroy(semaphore);
	}

	/* Producer-consumer test. */
	{
		TestBuffer	testBuffer;
		deThread	producer;
		deThread	consumer;
		deBool		ret;

		deMemset(&testBuffer, 0, sizeof(testBuffer));

		testBuffer.empty	= deSemaphore_create(DE_LENGTH_OF_ARRAY(testBuffer.buffer), DE_NULL);
		testBuffer.fill		= deSemaphore_create(0, DE_NULL);

		DE_TEST_ASSERT(testBuffer.empty && testBuffer.fill);

		consumer	= deThread_create(consumerThread, &testBuffer, DE_NULL);
		producer	= deThread_create(producerThread, &testBuffer, DE_NULL);

		DE_TEST_ASSERT(consumer && producer);

		ret = deThread_join(consumer) &&
			  deThread_join(producer);
		DE_TEST_ASSERT(ret);

		deThread_destroy(producer);
		deThread_destroy(consumer);

		deSemaphore_destroy(testBuffer.empty);
		deSemaphore_destroy(testBuffer.fill);
		DE_TEST_ASSERT(testBuffer.producerHash == testBuffer.consumerHash);
	}
}